

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::AnnotatePass1
          (MatchLiteralNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  ArenaAllocator *allocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  CharSet<char16_t> *pCVar2;
  char16_t **ppcVar3;
  int iVar4;
  int local_5c;
  int i;
  TrackAllocData local_48;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  Compiler *pCStack_18;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  
  (this->super_Node).features = 0x10;
  local_1c = parentNotNegated;
  local_1b = parentNotSpeculative;
  local_1a = parentAtLeastOnce;
  local_19 = parentNotInLoop;
  pCStack_18 = compiler;
  compiler_local = (Compiler *)this;
  CountDomain::Exact(&(this->super_Node).thisConsumes,this->length);
  pAVar1 = &pCStack_18->ctAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&CharSet<char16_t>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
             ,0x370);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_48);
  pCVar2 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar1,0x3f67b0);
  CharSet<char16_t>::CharSet(pCVar2);
  (this->super_Node).firstSet = pCVar2;
  local_5c = 0;
  while( true ) {
    iVar4 = 1;
    if ((this->isEquivClass & 1U) != 0) {
      iVar4 = 4;
    }
    if (iVar4 <= local_5c) break;
    pCVar2 = (this->super_Node).firstSet;
    allocator = pCStack_18->ctAllocator;
    ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                        ((WriteBarrierPtr *)&(pCStack_18->program->rep).insts.litbuf);
    CharSet<char16_t>::Set(pCVar2,allocator,(*ppcVar3)[this->offset + local_5c]);
    local_5c = local_5c + 1;
  }
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe | 1;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffef | 0x10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffdf | 0x20;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (uint)(local_19 & 1) << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (uint)(local_1a & 1) << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (uint)(local_1b & 1) << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (uint)(local_1c & 1) << 0xd;
  return;
}

Assistant:

void MatchLiteralNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasMatchLiteral;
        thisConsumes.Exact(length);
        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        for (int i = 0; i < (isEquivClass ? CaseInsensitive::EquivClassSize : 1); i++)
            firstSet->Set(compiler.ctAllocator, compiler.program->rep.insts.litbuf[offset + i]);
        isFirstExact = true;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }